

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

TRef crec_reassoc_ofs(jit_State *J,TRef tr,ptrdiff_t *ofsp,MSize sz)

{
  byte bVar1;
  IRIns *pIVar2;
  IRIns IVar3;
  ulong uVar4;
  long lVar5;
  
  if ((J->flags & 0x10000) != 0) {
    pIVar2 = (J->cur).ir;
    uVar4 = (ulong)tr & 0xffff;
    lVar5 = (long)*(short *)((long)pIVar2 + uVar4 * 8 + 2);
    if (-1 < lVar5) {
      bVar1 = *(byte *)((long)pIVar2 + uVar4 * 8 + 5);
      if (((ulong)bVar1 < 0x37) && ((0x60020000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        if (*(char *)((long)pIVar2 + lVar5 * 8 + 5) == '\x1d') {
          IVar3 = pIVar2[lVar5 + 1];
        }
        else {
          IVar3 = (IRIns)(long)pIVar2[lVar5].i;
        }
        lVar5 = -((long)IVar3 * (ulong)sz);
        if (bVar1 != 0x36) {
          lVar5 = (long)IVar3 * (ulong)sz;
        }
        *ofsp = *ofsp + lVar5;
        tr = (TRef)pIVar2[uVar4].field_0.op1;
      }
    }
  }
  return tr;
}

Assistant:

static TRef crec_reassoc_ofs(jit_State *J, TRef tr, ptrdiff_t *ofsp, MSize sz)
{
  IRIns *ir = IR(tref_ref(tr));
  if (LJ_LIKELY(J->flags & JIT_F_OPT_FOLD) && irref_isk(ir->op2) &&
      (ir->o == IR_ADD || ir->o == IR_ADDOV || ir->o == IR_SUBOV)) {
    IRIns *irk = IR(ir->op2);
    ptrdiff_t k;
    if (LJ_64 && irk->o == IR_KINT64)
      k = (ptrdiff_t)ir_kint64(irk)->u64 * sz;
    else
      k = (ptrdiff_t)irk->i * sz;
    if (ir->o == IR_SUBOV) *ofsp -= k; else *ofsp += k;
    tr = ir->op1;  /* Not a TRef, but the caller doesn't care. */
  }
  return tr;
}